

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O0

void __thiscall
NumericArgTest_MakeAndVisit_Test<unsigned_short>::TestBody
          (NumericArgTest_MakeAndVisit_Test<unsigned_short> *this)

{
  type_conflict8 tVar1;
  unsigned_short uVar2;
  MockSpec<test_result_(unsigned_int)> *this_00;
  StrictMock<mock_visitor<unsigned_int>_> *pSVar3;
  StrictMock<mock_visitor<unsigned_int>_> visitor_5;
  StrictMock<mock_visitor<unsigned_int>_> visitor_4;
  Type_conflict1 expected_2;
  StrictMock<mock_visitor<unsigned_int>_> visitor_3;
  StrictMock<mock_visitor<unsigned_int>_> visitor_2;
  Type_conflict1 expected_1;
  StrictMock<mock_visitor<unsigned_int>_> visitor_1;
  StrictMock<mock_visitor<unsigned_int>_> visitor;
  Type_conflict1 expected;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  *in_stack_fffffffffffff908;
  StrictMock<mock_visitor<unsigned_int>_> *in_stack_fffffffffffff910;
  StrictMock<mock_visitor<unsigned_int>_> *in_stack_fffffffffffff930;
  undefined8 in_stack_fffffffffffff938;
  uint uVar4;
  Matcher<unsigned_int> *in_stack_fffffffffffff940;
  char *in_stack_fffffffffffffa00;
  char *in_stack_fffffffffffffa08;
  int in_stack_fffffffffffffa14;
  char *in_stack_fffffffffffffa18;
  MockSpec<test_result_(unsigned_int)> *in_stack_fffffffffffffa20;
  undefined1 local_410 [198];
  unsigned_short local_34a;
  uint local_240;
  type_conflict8 local_23a;
  type_conflict8 local_12a;
  uint local_c;
  
  uVar4 = (uint)((ulong)in_stack_fffffffffffff938 >> 0x20);
  tVar1 = test_value<unsigned_short>();
  local_c = (uint)tVar1;
  testing::StrictMock<mock_visitor<unsigned_int>_>::StrictMock(in_stack_fffffffffffff930);
  testing::Matcher<unsigned_int>::Matcher(in_stack_fffffffffffff940,uVar4);
  mock_visitor<unsigned_int>::gmock_visit
            ((mock_visitor<unsigned_int> *)in_stack_fffffffffffff910,
             (Matcher<unsigned_int> *)in_stack_fffffffffffff908);
  testing::internal::MockSpec<test_result_(unsigned_int)>::InternalExpectedAt
            (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,in_stack_fffffffffffffa14,
             in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  testing::Matcher<unsigned_int>::~Matcher((Matcher<unsigned_int> *)0x14cd6a);
  local_12a = test_value<unsigned_short>();
  (anonymous_namespace)::
  make_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_short>
            ((unsigned_short *)in_stack_fffffffffffff910);
  fmt::v5::
  visit<testing::StrictMock<mock_visitor<unsigned_int>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            (in_stack_fffffffffffff910,
             (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              *)in_stack_fffffffffffff908);
  testing::StrictMock<mock_visitor<unsigned_int>_>::~StrictMock(in_stack_fffffffffffff910);
  testing::StrictMock<mock_visitor<unsigned_int>_>::StrictMock(in_stack_fffffffffffff930);
  testing::Matcher<unsigned_int>::Matcher(in_stack_fffffffffffff940,uVar4);
  mock_visitor<unsigned_int>::gmock_visit
            ((mock_visitor<unsigned_int> *)in_stack_fffffffffffff910,
             (Matcher<unsigned_int> *)in_stack_fffffffffffff908);
  testing::internal::MockSpec<test_result_(unsigned_int)>::InternalExpectedAt
            (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,in_stack_fffffffffffffa14,
             in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  testing::Matcher<unsigned_int>::~Matcher((Matcher<unsigned_int> *)0x14ce3a);
  local_23a = test_value<unsigned_short>();
  (anonymous_namespace)::
  make_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>,unsigned_short>
            ((unsigned_short *)in_stack_fffffffffffff910);
  fmt::v5::
  visit<testing::StrictMock<mock_visitor<unsigned_int>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            (in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  testing::StrictMock<mock_visitor<unsigned_int>_>::~StrictMock(in_stack_fffffffffffff910);
  uVar2 = std::numeric_limits<unsigned_short>::min();
  local_240 = (uint)uVar2;
  testing::StrictMock<mock_visitor<unsigned_int>_>::StrictMock(in_stack_fffffffffffff930);
  testing::Matcher<unsigned_int>::Matcher(in_stack_fffffffffffff940,uVar4);
  this_00 = mock_visitor<unsigned_int>::gmock_visit
                      ((mock_visitor<unsigned_int> *)in_stack_fffffffffffff910,
                       (Matcher<unsigned_int> *)in_stack_fffffffffffff908);
  testing::internal::MockSpec<test_result_(unsigned_int)>::InternalExpectedAt
            (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,in_stack_fffffffffffffa14,
             in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  testing::Matcher<unsigned_int>::~Matcher((Matcher<unsigned_int> *)0x14cf19);
  local_34a = std::numeric_limits<unsigned_short>::min();
  (anonymous_namespace)::
  make_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_short>
            ((unsigned_short *)in_stack_fffffffffffff910);
  fmt::v5::
  visit<testing::StrictMock<mock_visitor<unsigned_int>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            (in_stack_fffffffffffff910,
             (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              *)in_stack_fffffffffffff908);
  testing::StrictMock<mock_visitor<unsigned_int>_>::~StrictMock(in_stack_fffffffffffff910);
  testing::StrictMock<mock_visitor<unsigned_int>_>::StrictMock(in_stack_fffffffffffff930);
  uVar4 = (uint)((ulong)local_410 >> 0x20);
  testing::Matcher<unsigned_int>::Matcher((Matcher<unsigned_int> *)this_00,uVar4);
  pSVar3 = (StrictMock<mock_visitor<unsigned_int>_> *)
           mock_visitor<unsigned_int>::gmock_visit
                     ((mock_visitor<unsigned_int> *)in_stack_fffffffffffff910,
                      (Matcher<unsigned_int> *)in_stack_fffffffffffff908);
  testing::internal::MockSpec<test_result_(unsigned_int)>::InternalExpectedAt
            (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,in_stack_fffffffffffffa14,
             in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  testing::Matcher<unsigned_int>::~Matcher((Matcher<unsigned_int> *)0x14cfdd);
  std::numeric_limits<unsigned_short>::min();
  (anonymous_namespace)::
  make_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>,unsigned_short>
            ((unsigned_short *)in_stack_fffffffffffff910);
  fmt::v5::
  visit<testing::StrictMock<mock_visitor<unsigned_int>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            (in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  testing::StrictMock<mock_visitor<unsigned_int>_>::~StrictMock(in_stack_fffffffffffff910);
  std::numeric_limits<unsigned_short>::max();
  testing::StrictMock<mock_visitor<unsigned_int>_>::StrictMock(pSVar3);
  testing::Matcher<unsigned_int>::Matcher((Matcher<unsigned_int> *)this_00,uVar4);
  mock_visitor<unsigned_int>::gmock_visit
            ((mock_visitor<unsigned_int> *)in_stack_fffffffffffff910,
             (Matcher<unsigned_int> *)in_stack_fffffffffffff908);
  testing::internal::MockSpec<test_result_(unsigned_int)>::InternalExpectedAt
            (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,in_stack_fffffffffffffa14,
             in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  testing::Matcher<unsigned_int>::~Matcher((Matcher<unsigned_int> *)0x14d0b0);
  std::numeric_limits<unsigned_short>::max();
  (anonymous_namespace)::
  make_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_short>
            ((unsigned_short *)in_stack_fffffffffffff910);
  fmt::v5::
  visit<testing::StrictMock<mock_visitor<unsigned_int>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            (in_stack_fffffffffffff910,
             (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              *)in_stack_fffffffffffff908);
  testing::StrictMock<mock_visitor<unsigned_int>_>::~StrictMock(in_stack_fffffffffffff910);
  testing::StrictMock<mock_visitor<unsigned_int>_>::StrictMock(pSVar3);
  testing::Matcher<unsigned_int>::Matcher((Matcher<unsigned_int> *)this_00,uVar4);
  pSVar3 = (StrictMock<mock_visitor<unsigned_int>_> *)
           mock_visitor<unsigned_int>::gmock_visit
                     ((mock_visitor<unsigned_int> *)in_stack_fffffffffffff910,
                      (Matcher<unsigned_int> *)in_stack_fffffffffffff908);
  testing::internal::MockSpec<test_result_(unsigned_int)>::InternalExpectedAt
            (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,in_stack_fffffffffffffa14,
             in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  testing::Matcher<unsigned_int>::~Matcher((Matcher<unsigned_int> *)0x14d174);
  std::numeric_limits<unsigned_short>::max();
  (anonymous_namespace)::
  make_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>,unsigned_short>
            ((unsigned_short *)pSVar3);
  fmt::v5::
  visit<testing::StrictMock<mock_visitor<unsigned_int>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            (pSVar3,in_stack_fffffffffffff908);
  testing::StrictMock<mock_visitor<unsigned_int>_>::~StrictMock(pSVar3);
  return;
}

Assistant:

TYPED_TEST(NumericArgTest, MakeAndVisit) {
  CHECK_ARG(test_value<TypeParam>(), typename);
  CHECK_ARG(std::numeric_limits<TypeParam>::min(), typename);
  CHECK_ARG(std::numeric_limits<TypeParam>::max(), typename);
}